

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall AGSMock::MockEngine::free_all(MockEngine *this)

{
  _Rb_tree_header *p_Var1;
  _Hash_node_base *p_Var2;
  mapped_type *ppvVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *__range2;
  _Hash_node_base *p_Var6;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> object_list;
  _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  _Stack_58;
  
  p_Var1 = &_Stack_58._M_impl.super__Rb_tree_header;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = (this->data_->objects)._M_h._M_before_begin._M_nxt;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      p_Var2 = p_Var6[1]._M_nxt;
      ppvVar3 = std::
                map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
                operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                            *)&_Stack_58,(key_type *)((long)&p_Var6[2]._M_nxt + 4));
      *ppvVar3 = p_Var2;
      p_Var6 = p_Var6->_M_nxt;
      p_Var4 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (p_Var6 != (_Hash_node_base *)0x0);
    for (; (_Rb_tree_header *)p_Var4 != p_Var1;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      free(this,p_Var4[1]._M_parent);
    }
  }
  if ((this->data_->objects)._M_h._M_element_count != 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Warning: some resource persisted disposal.",0x2a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::
    _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
    ::clear(&_Stack_58);
    for (p_Var6 = (this->data_->objects)._M_h._M_before_begin._M_nxt;
        p_Var4 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left,
        p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
      p_Var2 = p_Var6[1]._M_nxt;
      ppvVar3 = std::
                map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
                operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                            *)&_Stack_58,(key_type *)((long)&p_Var6[2]._M_nxt + 4));
      *ppvVar3 = p_Var2;
    }
    for (; (_Rb_tree_header *)p_Var4 != p_Var1;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      free(this,p_Var4[1]._M_parent);
    }
  }
  std::
  _Hashtable<void_*,_std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->data_->objects)._M_h);
  std::
  _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  ::~_Rb_tree(&_Stack_58);
  return;
}

Assistant:

void MockEngine::free_all()
{
	map<int, void *> object_list;
	for (auto &object : data_->objects)
		object_list[object.second.key] = object.first;

	for (auto &object : object_list)
		free(object.second);

	if (data_->objects.size() > 0)
	{
		using namespace std;
		cout << endl << "Warning: some resource persisted disposal." << endl;

		object_list.clear();
		for (auto &object : data_->objects)
			object_list[object.second.key] = object.first;

		for (auto &object : object_list)
			free(object.second, true);
	}

	data_->objects.clear();
}